

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O0

UChar32 T_UConverter_getNextUChar_UTF32_LE(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  byte *__src;
  int iVar2;
  uint uVar3;
  int32_t length;
  UChar32 myUChar;
  uint8_t *mySource;
  UErrorCode *err_local;
  UConverterToUnicodeArgs *args_local;
  
  __src = (byte *)args->source;
  if (__src < args->sourceLimit) {
    iVar2 = (int)args->sourceLimit - (int)__src;
    if (iVar2 < 4) {
      memcpy(args->converter->toUBytes,__src,(long)iVar2);
      args->converter->toULength = (int8_t)iVar2;
      args->source = (char *)(__src + iVar2);
      *err = U_TRUNCATED_CHAR_FOUND;
      args_local._4_4_ = 0xffff;
    }
    else {
      uVar3 = (uint)__src[3] << 0x18 | (uint)__src[2] << 0x10;
      bVar1 = __src[1];
      args_local._4_4_ = uVar3 | (uint)bVar1 << 8 | (uint)*__src;
      args->source = (char *)(__src + 4);
      if ((0x10ffff < args_local._4_4_) || ((uVar3 | (uint)bVar1 << 8 & 0xfffff800) == 0xd800)) {
        *(undefined4 *)args->converter->toUBytes = *(undefined4 *)__src;
        args->converter->toULength = '\x04';
        *err = U_ILLEGAL_CHAR_FOUND;
        args_local._4_4_ = 0xffff;
      }
    }
  }
  else {
    *err = U_INDEX_OUTOFBOUNDS_ERROR;
    args_local._4_4_ = 0xffff;
  }
  return args_local._4_4_;
}

Assistant:

static UChar32 U_CALLCONV
T_UConverter_getNextUChar_UTF32_LE(UConverterToUnicodeArgs* args,
                                   UErrorCode* err)
{
    const uint8_t *mySource;
    UChar32 myUChar;
    int32_t length;

    mySource = (const uint8_t *)args->source;
    if (mySource >= (const uint8_t *)args->sourceLimit)
    {
        /* no input */
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0xffff;
    }

    length = (int32_t)((const uint8_t *)args->sourceLimit - mySource);
    if (length < 4) 
    {
        /* got a partial character */
        uprv_memcpy(args->converter->toUBytes, mySource, length);
        args->converter->toULength = (int8_t)length;
        args->source = (const char *)(mySource + length);
        *err = U_TRUNCATED_CHAR_FOUND;
        return 0xffff;
    }

    /* Don't even try to do a direct cast because the value may be on an odd address. */
    myUChar = ((UChar32)mySource[3] << 24)
            | ((UChar32)mySource[2] << 16)
            | ((UChar32)mySource[1] << 8)
            | ((UChar32)mySource[0]);

    args->source = (const char *)(mySource + 4);
    if ((uint32_t)myUChar <= MAXIMUM_UTF && !U_IS_SURROGATE(myUChar)) {
        return myUChar;
    }

    uprv_memcpy(args->converter->toUBytes, mySource, 4);
    args->converter->toULength = 4;

    *err = U_ILLEGAL_CHAR_FOUND;
    return 0xffff;
}